

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

unsigned_long QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(int *i)

{
  uint uVar1;
  unsigned_long uVar2;
  type ii;
  int *i_local;
  
  uVar1 = *i;
  if (-1 < *i) {
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 <= uVar2) goto LAB_00149cf1;
  }
  error(*i);
LAB_00149cf1:
  return (long)*i;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is signed, and To is unsigned. If i > 0, it's safe to
            // convert it to the corresponding unsigned type and to
            // compare with To's max.
            auto ii = static_cast<typename to_u<From>::type>(i);
            if ((i < 0) || (ii > std::numeric_limits<To>::max())) {
                error(i);
            }
            return static_cast<To>(i);
        }